

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhitm.c
# Opt level: O2

boolean hmon(monst *mon,obj *obj,obj *ostack,boolean thrown)

{
  char cVar1;
  boolean bVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  monst *pmVar7;
  bool bVar8;
  
  bVar5 = true;
  if ((*(uint *)&mon->field_0x60 >> 0x16 & 1) != 0) {
    if ((*(uint *)&mon->field_0x60 & 0x12000000) == 0) {
      bVar5 = mon->data != mons + 0x126 && mon->data != mons + 0x125;
    }
    else {
      bVar5 = false;
    }
  }
  if (obj != (obj *)0x0) {
    if (obj->oclass == '\x02') {
      bVar8 = objects[obj->otyp].oc_subtyp == '\x02';
    }
    else {
      bVar8 = false;
    }
    bVar2 = oprop_stealth_attack(obj,ostack,uwep,thrown);
    if (bVar2 != '\0') {
      oprop_id(0x4000,obj,ostack,uwep);
      goto LAB_00260890;
    }
    if (thrown != '\0') {
      if ((obj->oclass == '\r') || (obj->oclass == '\x02')) {
        cVar1 = objects[obj->otyp].oc_subtyp;
        if ((-0x19 < cVar1) &&
           (((uwep != (obj *)0x0 && cVar1 < -0x15 &&
             ((int)cVar1 + (int)objects[uwep->otyp].oc_subtyp == 0)) &&
            (uVar4 = mt_random(), uVar4 % 3 != 0)))) goto LAB_00260890;
      }
      if ((ushort)(obj->otyp - 7U) < 2 || bVar8) goto LAB_00260890;
    }
    if ((bool)(bVar8 & (u.uprops[0x13].blocked == 0 &&
                       (u.uprops[0x13].intrinsic != 0 || u.uprops[0x13].extrinsic != 0))))
    goto LAB_00260890;
  }
  iVar6 = 9;
  if (u.uprops[0x13].blocked != 0) {
    iVar6 = 0x40;
  }
  if (u.uprops[0x13].extrinsic == 0 && u.uprops[0x13].intrinsic == 0) {
    iVar6 = 0x40;
  }
  if ((obj != (obj *)0x0) &&
     (((obj->oclass != '\x02' || (obj->oartifact == '\x05')) || (obj->otyp == 0x41)))) {
    iVar6 = 0x40;
  }
  pmVar7 = (monst *)&level->monlist;
  while (pmVar7 = pmVar7->nmon, pmVar7 != (monst *)0x0) {
    iVar3 = dist2((int)mon->mx,(int)mon->my,(int)pmVar7->mx,(int)pmVar7->my);
    if ((iVar3 < iVar6) && (iVar3 = rn2((uint)(urole.malenum != 0x164) * 2 + 3), iVar3 != 0)) {
      pmVar7->field_0x62 = pmVar7->field_0x62 & 0xf7;
    }
  }
LAB_00260890:
  bVar2 = hmon_hitmon(mon,obj,ostack,thrown);
  if (((mon->field_0x63 & 0x10) != 0) && (uVar4 = mt_random(), (uVar4 & 1) == 0)) {
    ghod_hitsu(mon);
  }
  if (!bVar5) {
    angry_guards(flags.soundok == '\0');
  }
  return bVar2;
}

Assistant:

boolean hmon(struct monst *mon, struct obj *obj,
	     struct obj *ostack, boolean thrown)
{
	boolean result, anger_guards;

	anger_guards = (mon->mpeaceful &&
			    (mon->ispriest || mon->isshk ||
			     mon->data == &mons[PM_WATCHMAN] ||
			     mon->data == &mons[PM_WATCH_CAPTAIN]));

	/* check to see if what we're doing would wake up nearby critters */
	noisy_hit(mon, obj, ostack, thrown);

	/* go ahead and 'hit' the monster */
	result = hmon_hitmon(mon, obj, ostack, thrown);

	if (mon->ispriest && !rn2(2))
	    ghod_hitsu(mon);
	if (anger_guards)
	    angry_guards(!flags.soundok);

	return result;
}